

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O0

double __thiscall IF97::Region3::delta2_d2phi_ddelta2(Region3 *this,double T,double rho)

{
  double dVar1;
  int iVar2;
  int iVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  double dVar6;
  double dVar7;
  ulong local_40;
  size_t i;
  double summer;
  double tau;
  double delta;
  double rho_local;
  double T_local;
  Region3 *this_local;
  
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->nr,0);
  i = (size_t)-*pvVar4;
  for (local_40 = 1; local_40 < 0x28; local_40 = local_40 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->nr,local_40);
    dVar1 = *pvVar4;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->Ir,local_40);
    iVar2 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->Ir,local_40);
    iVar3 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->Ir,local_40);
    dVar6 = powi(rho / 322.0,*pvVar5);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->Jr,local_40);
    dVar7 = powi(647.096 / T,*pvVar5);
    i = (size_t)(dVar1 * (double)iVar2 * (double)(iVar3 + -1) * dVar6 * dVar7 + (double)i);
  }
  return (double)i;
}

Assistant:

double delta2_d2phi_ddelta2(double T, double rho) const{
            const double delta = rho/Rhocrit, tau = Tcrit/T;
            double summer = -nr[0];
            for (std::size_t i = 1; i < 40; ++i){
                summer += nr[i]*Ir[i]*(Ir[i]-1)*powi(delta, Ir[i])*powi(tau, Jr[i]);
            }
            return summer;
        }